

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string_view package_name)

{
  string_view prefix;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  bool local_6a;
  bool local_69;
  string_view local_68;
  string_view local_58;
  DescriptorBuilder *local_48;
  size_t local_40;
  string_view local_38;
  FileDescriptor *local_28;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  string_view package_name_local;
  
  package_name_local._M_len = (size_t)package_name._M_str;
  this_local = (DescriptorBuilder *)package_name._M_len;
  local_28 = file;
  file_local = (FileDescriptor *)this;
  local_38 = FileDescriptor::package(file);
  local_48 = this_local;
  local_40 = package_name_local._M_len;
  prefix._M_str = (char *)package_name_local._M_len;
  prefix._M_len = (size_t)this_local;
  bVar1 = absl::lts_20250127::StartsWith(local_38,prefix);
  local_69 = false;
  if (bVar1) {
    local_58 = FileDescriptor::package(local_28);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_58);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    local_6a = true;
    if (sVar2 != sVar3) {
      local_68 = FileDescriptor::package(local_28);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_68,sVar2);
      local_6a = *pvVar4 == '.';
    }
    local_69 = local_6a;
  }
  return local_69;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    absl::string_view package_name) {
  return absl::StartsWith(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}